

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

bool miniros::xml_cast<bool>(RpcValue *xml_value)

{
  Type TVar1;
  Type *pTVar2;
  double *pdVar3;
  int *piVar4;
  bool *pbVar5;
  XmlRpcValue *in_RDI;
  undefined1 local_1;
  
  pTVar2 = XmlRpc::XmlRpcValue::getType(in_RDI);
  TVar1 = *pTVar2;
  if (TVar1 == TypeBoolean) {
    pbVar5 = XmlRpc::XmlRpcValue::operator_cast_to_bool_(in_RDI);
    local_1 = (bool)(*pbVar5 & 1);
  }
  else if (TVar1 == TypeInt) {
    piVar4 = XmlRpc::XmlRpcValue::operator_cast_to_int_(in_RDI);
    local_1 = *piVar4 != 0;
  }
  else if (TVar1 == TypeDouble) {
    pdVar3 = XmlRpc::XmlRpcValue::operator_cast_to_double_(in_RDI);
    local_1 = *pdVar3 != 0.0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool xml_cast(MasterLink::RpcValue xml_value)
{
  using namespace XmlRpc;
  switch (xml_value.getType()) {
    case XmlRpcValue::TypeDouble:
      return static_cast<bool>(static_cast<double>(xml_value));
    case XmlRpcValue::TypeInt:
      return static_cast<bool>(static_cast<int>(xml_value));
    case XmlRpcValue::TypeBoolean:
      return static_cast<bool>(xml_value);
    default:
      return false;
  };
}